

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

void db_compact_overwrite(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  fdb_kvs_handle *in_stack_fffffffffffff6d8;
  fdb_file_handle *in_stack_fffffffffffff6e0;
  fdb_doc **in_stack_fffffffffffff6e8;
  size_t in_stack_fffffffffffff700;
  fdb_kvs_info *in_stack_fffffffffffff840;
  fdb_kvs_handle *in_stack_fffffffffffff848;
  fdb_kvs_config *in_stack_fffffffffffff880;
  char *in_stack_fffffffffffff888;
  fdb_kvs_handle **in_stack_fffffffffffff890;
  fdb_file_handle *in_stack_fffffffffffff898;
  long alStack_748 [8];
  fdb_config *in_stack_fffffffffffff8f8;
  char *in_stack_fffffffffffff900;
  fdb_file_handle **in_stack_fffffffffffff908;
  undefined1 local_5e0 [248];
  char local_4e8 [8];
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_config kvs_config;
  fdb_kvs_info kvs_info;
  fdb_config fconfig;
  fdb_doc *pfStack_a0;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc2;
  fdb_doc **doc;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile2;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  memcpy(&kvs_info.file,local_5e0,0xf8);
  fdb_get_default_kvs_config();
  fdb_open(in_stack_fffffffffffff908,in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  fdb_kvs_open(in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888,
               in_stack_fffffffffffff880);
  fVar1 = fdb_set_log_callback(db2,logCallbackFunc,"db_destroy_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x548);
    db_compact_overwrite::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x548,"void db_compact_overwrite()");
    }
  }
  for (n = 0; n < 0x1e; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf(local_4e8,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar4 = (void *)0x10adc7;
    sVar3 = strlen(local_4e8);
    fdb_doc_create(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
                   (size_t)in_stack_fffffffffffff6d8,pvVar4,sVar3,(void *)0x10adfe,
                   in_stack_fffffffffffff700);
    fdb_set(db2,(fdb_doc *)alStack_748[n]);
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff6d8,'\0');
  fdb_open(in_stack_fffffffffffff908,in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  fdb_kvs_open(in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888,
               in_stack_fffffffffffff880);
  fVar1 = fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"db_destroy_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x558);
    db_compact_overwrite::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x558,"void db_compact_overwrite()");
    }
  }
  for (n = 0; n < 0x3c; n = n + 1) {
    sprintf(metabuf + 0xf8,"k2ey%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"m2eta%d",(ulong)(uint)n);
    sprintf(local_4e8,"b2ody%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar4 = (void *)0x10afb6;
    sVar3 = strlen(local_4e8);
    fdb_doc_create(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
                   (size_t)in_stack_fffffffffffff6d8,pvVar4,sVar3,(void *)0x10afed,
                   in_stack_fffffffffffff700);
    fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffff6d8 + (long)n * 8));
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff6d8,'\0');
  fdb_get_kvs_info(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  if (kvs_info.name != (char *)0x3c) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x567);
    db_compact_overwrite::__test_pass = 0;
    if (kvs_info.name != (char *)0x3c) {
      __assert_fail("kvs_info.last_seqnum == (uint64_t)2*n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x567,"void db_compact_overwrite()");
    }
  }
  fdb_kvs_close(in_stack_fffffffffffff6d8);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffff6d8);
  fVar1 = fdb_compact(in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x56d);
    db_compact_overwrite::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x56d,"void db_compact_overwrite()");
    }
  }
  fdb_kvs_close(in_stack_fffffffffffff6d8);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffff6d8);
  fdb_open(in_stack_fffffffffffff908,in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  fdb_kvs_open(in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888,
               in_stack_fffffffffffff880);
  pvVar4 = (void *)0x10b189;
  fVar1 = fdb_set_log_callback(db2,logCallbackFunc,"db_destroy_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pvVar4 = (void *)0x10b1bc;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x578);
    db_compact_overwrite::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x578,"void db_compact_overwrite()");
    }
  }
  n = 0;
  do {
    if (0x1d < n) {
      fdb_open(in_stack_fffffffffffff908,in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
      fdb_kvs_open(in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888,
                   in_stack_fffffffffffff880);
      fVar1 = fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"db_destroy_test");
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x58a);
        db_compact_overwrite::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x58a,"void db_compact_overwrite()");
        }
      }
      pvVar4 = (void *)0x10b52b;
      fdb_get_kvs_info(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
      if (kvs_info.name != (char *)0x3c) {
        pvVar4 = (void *)0x10b562;
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x58d);
        db_compact_overwrite::__test_pass = 0;
        if (kvs_info.name != (char *)0x3c) {
          __assert_fail("kvs_info.last_seqnum == (uint64_t)2*n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x58d,"void db_compact_overwrite()");
        }
      }
      n = 0;
      do {
        if (0x3b < n) {
          for (n = 0; n < 0x1e; n = n + 1) {
            fdb_doc_free((fdb_doc *)0x10b843);
            fdb_doc_free((fdb_doc *)0x10b857);
          }
          for (n = 0x1e; n < 0x3c; n = n + 1) {
            fdb_doc_free((fdb_doc *)0x10b888);
          }
          fdb_kvs_close(in_stack_fffffffffffff6d8);
          fdb_close((fdb_file_handle *)in_stack_fffffffffffff6d8);
          fdb_kvs_close(in_stack_fffffffffffff6d8);
          fdb_close((fdb_file_handle *)in_stack_fffffffffffff6d8);
          fdb_shutdown();
          memleak_end();
          if (db_compact_overwrite::__test_pass == 0) {
            fprintf(_stderr,"%s FAILED\n","compact overwrite");
          }
          else {
            fprintf(_stderr,"%s PASSED\n","compact overwrite");
          }
          return;
        }
        fdb_doc_create(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
                       (size_t)in_stack_fffffffffffff6d8,pvVar4,0,(void *)0x10b601,
                       in_stack_fffffffffffff700);
        fVar1 = fdb_get((fdb_kvs_handle *)doc,pfStack_a0);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x594);
          db_compact_overwrite::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x594,"void db_compact_overwrite()");
          }
        }
        iVar2 = memcmp(pfStack_a0->meta,
                       *(void **)(*(long *)(&stack0xfffffffffffff6d8 + (long)n * 8) + 0x38),
                       pfStack_a0->metalen);
        if (iVar2 != 0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x595);
          db_compact_overwrite::__test_pass = 0;
          iVar2 = memcmp(pfStack_a0->meta,
                         *(void **)(*(long *)(&stack0xfffffffffffff6d8 + (long)n * 8) + 0x38),
                         pfStack_a0->metalen);
          if (iVar2 != 0) {
            __assert_fail("!memcmp(rdoc->meta, doc2[i]->meta, rdoc->metalen)",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x595,"void db_compact_overwrite()");
          }
        }
        iVar2 = memcmp(pfStack_a0->body,
                       *(void **)(*(long *)(&stack0xfffffffffffff6d8 + (long)n * 8) + 0x40),
                       pfStack_a0->bodylen);
        if (iVar2 != 0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x596);
          db_compact_overwrite::__test_pass = 0;
          iVar2 = memcmp(pfStack_a0->body,
                         *(void **)(*(long *)(&stack0xfffffffffffff6d8 + (long)n * 8) + 0x40),
                         pfStack_a0->bodylen);
          if (iVar2 != 0) {
            __assert_fail("!memcmp(rdoc->body, doc2[i]->body, rdoc->bodylen)",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x596,"void db_compact_overwrite()");
          }
        }
        pvVar4 = (void *)0x10b812;
        fdb_doc_free((fdb_doc *)0x10b812);
        n = n + 1;
      } while( true );
    }
    fdb_doc_create(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
                   (size_t)in_stack_fffffffffffff6d8,pvVar4,0,(void *)0x10b24d,
                   in_stack_fffffffffffff700);
    fVar1 = fdb_get(db2,pfStack_a0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x57e);
      db_compact_overwrite::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x57e,"void db_compact_overwrite()");
      }
    }
    iVar2 = memcmp(pfStack_a0->meta,*(void **)(alStack_748[n] + 0x38),pfStack_a0->metalen);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x57f);
      db_compact_overwrite::__test_pass = 0;
      iVar2 = memcmp(pfStack_a0->meta,*(void **)(alStack_748[n] + 0x38),pfStack_a0->metalen);
      if (iVar2 != 0) {
        __assert_fail("!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x57f,"void db_compact_overwrite()");
      }
    }
    iVar2 = memcmp(pfStack_a0->body,*(void **)(alStack_748[n] + 0x40),pfStack_a0->bodylen);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x580);
      db_compact_overwrite::__test_pass = 0;
      iVar2 = memcmp(pfStack_a0->body,*(void **)(alStack_748[n] + 0x40),pfStack_a0->bodylen);
      if (iVar2 != 0) {
        __assert_fail("!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x580,"void db_compact_overwrite()");
      }
    }
    pvVar4 = (void *)0x10b45e;
    fdb_doc_free((fdb_doc *)0x10b45e);
    n = n + 1;
  } while( true );
}

Assistant:

void db_compact_overwrite()
{
    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 30;
    fdb_file_handle *dbfile, *dbfile2;
    fdb_kvs_handle *db, *db2;
    fdb_doc **doc = alca(fdb_doc *, n);
    fdb_doc **doc2 = alca(fdb_doc *, 2*n);
    fdb_doc *rdoc;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_info kvs_info;
    fdb_kvs_config kvs_config;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL " compact_test* > errorlog.txt");
    (void)r;

    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // write to db1
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "db_destroy_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // Open the empty db with future compact name
    fdb_open(&dbfile2, "./compact_test1.1", &fconfig);
    fdb_kvs_open(dbfile2, &db2, NULL, &kvs_config);
    status = fdb_set_log_callback(db2, logCallbackFunc,
                                  (void *) "db_destroy_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // write to db2
    for (i=0;i < 2*n;++i){
        sprintf(keybuf, "k2ey%d", i);
        sprintf(metabuf, "m2eta%d", i);
        sprintf(bodybuf, "b2ody%d", i);
        fdb_doc_create(&doc2[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db2, doc2[i]);
    }
    fdb_commit(dbfile2, FDB_COMMIT_NORMAL);


    // verify db2 seqnum and close
    fdb_get_kvs_info(db2, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == (uint64_t)2*n);
    fdb_kvs_close(db2);
    fdb_close(dbfile2);

    // compact db1
    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db1
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen db1
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "db_destroy_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // read db1
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen));
        // free result document
        fdb_doc_free(rdoc);
    }

    // reopen db2
    fdb_open(&dbfile2, "./compact_test1.1", &fconfig);
    fdb_kvs_open(dbfile2, &db2, NULL, &kvs_config);
    status = fdb_set_log_callback(db2, logCallbackFunc,
                                  (void *) "db_destroy_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_get_kvs_info(db2, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == (uint64_t)2*n);

    // read db2
    for (i=0;i<2*n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc2[i]->key, doc2[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->meta, doc2[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc2[i]->body, rdoc->bodylen));
        // free result document
        fdb_doc_free(rdoc);
    }

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
        fdb_doc_free(doc2[i]);
    }
    for (i=n;i<2*n;++i){
        fdb_doc_free(doc2[i]);
    }

    fdb_kvs_close(db);
    fdb_close(dbfile);
    fdb_kvs_close(db2);
    fdb_close(dbfile2);


    fdb_shutdown();
    memleak_end();
    TEST_RESULT("compact overwrite");
}